

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O1

string * __thiscall
cmCPackIFWGenerator::GetComponentPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,cmCPackComponent *component)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  cmCPackIFWPackage *pcVar6;
  long *plVar7;
  char *__s;
  size_t sVar8;
  size_type *psVar9;
  long *plVar10;
  bool bVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string local_f8;
  _Alloc_hider local_d8;
  size_type local_d0;
  char local_c8;
  undefined7 uStack_c7;
  undefined1 uStack_c0;
  undefined4 uStack_bf;
  undefined2 uStack_bb;
  char cStack_b9;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string local_98;
  long *local_78 [2];
  long local_68 [2];
  cmCPackIFWCommon *local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_d0 = 0;
  local_c8 = '\0';
  local_d8._M_p = &local_c8;
  if (component == (cmCPackComponent *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 1) = CONCAT17(uStack_c0,uStack_c7);
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = uStack_bf;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = uStack_bb;
    (__return_storage_ptr__->field_2)._M_local_buf[0xf] = cStack_b9;
    __return_storage_ptr__->_M_string_length = 0;
    local_d0 = 0;
    local_c8 = '\0';
    goto LAB_00168388;
  }
  pcVar6 = GetComponentPackage(this,component);
  if (pcVar6 != (cmCPackIFWPackage *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pcVar6->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pcVar6->Name)._M_string_length);
    goto LAB_00168388;
  }
  cmsys::SystemTools::UpperCase(&local_98,&component->Name);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x4da9b9);
  paVar1 = &local_f8.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_f8.field_2._M_allocated_capacity = *psVar9;
    local_f8.field_2._8_8_ = plVar7[3];
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar9;
    local_f8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_f8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_f8);
  local_b8 = &local_a8;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_a8 = *plVar10;
    lStack_a0 = plVar7[3];
  }
  else {
    local_a8 = *plVar10;
    local_b8 = (long *)*plVar7;
  }
  local_b0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_b8,local_b0 + (long)local_b8);
  std::__cxx11::string::append((char *)&local_f8);
  local_58 = &this->super_cmCPackIFWCommon;
  __s = cmCPackIFWCommon::GetOption(local_58,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (__s == (char *)0x0) {
    pcVar3 = (component->Name)._M_dataplus._M_p;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar3,pcVar3 + (component->Name)._M_string_length);
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    sVar8 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,__s,__s + sVar8);
  }
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (component->Group == (cmCPackComponentGroup *)0x0) {
LAB_0016832a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_d8._M_p == &local_c8) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_c7,local_c8);
      *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
           CONCAT17(cStack_b9,CONCAT25(uStack_bb,CONCAT41(uStack_bf,uStack_c0)));
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_d8._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_c7,local_c8);
    }
    __return_storage_ptr__->_M_string_length = local_d0;
    local_d0 = 0;
    local_c8 = '\0';
    local_d8._M_p = &local_c8;
  }
  else {
    pcVar6 = GetGroupPackage(this,component->Group);
    bVar4 = true;
    if ((this->super_cmCPackGenerator).componentPackageMethod != ONE_PACKAGE_PER_GROUP) {
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_b8,local_b0 + (long)local_b8);
      std::__cxx11::string::append((char *)&local_f8);
      bVar4 = cmCPackIFWCommon::IsOn(local_58,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar4 == false) {
      bVar2 = this->ResolveDuplicateNames;
      if ((bVar2 == false) &&
         (std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_d8),
         local_98._M_string_length == (pcVar6->Name)._M_string_length)) {
        if (local_98._M_string_length == 0) {
          bVar11 = true;
        }
        else {
          iVar5 = bcmp(local_98._M_dataplus._M_p,(pcVar6->Name)._M_dataplus._M_p,
                       local_98._M_string_length);
          bVar11 = iVar5 == 0;
        }
      }
      else {
        bVar11 = false;
      }
      if ((bVar2 == false) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2)) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar11 && (bVar2 & 1U) == 0) {
        pcVar3 = (pcVar6->Name)._M_dataplus._M_p;
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,pcVar3,pcVar3 + (pcVar6->Name)._M_string_length);
        std::__cxx11::string::append((char *)local_78);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_78,(ulong)local_d8._M_p);
        plVar10 = plVar7 + 2;
        if ((long *)*plVar7 == plVar10) {
          local_40 = *plVar10;
          lStack_38 = plVar7[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar10;
          local_50 = (long *)*plVar7;
        }
        local_48 = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0],local_68[0] + 1);
        }
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (pcVar6->Name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (pcVar6->Name)._M_string_length);
    }
    if (bVar4 == false) goto LAB_0016832a;
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
LAB_00168388:
  if (local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,CONCAT71(uStack_c7,local_c8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetComponentPackageName(
  cmCPackComponent* component) const
{
  std::string name;
  if (!component) {
    return name;
  }
  if (cmCPackIFWPackage* package = this->GetComponentPackage(component)) {
    return package->Name;
  }
  std::string prefix = "CPACK_IFW_COMPONENT_" +
    cmsys::SystemTools::UpperCase(component->Name) + "_";
  const char* option = this->GetOption(prefix + "NAME");
  name = option ? option : component->Name;
  if (component->Group) {
    cmCPackIFWPackage* package = this->GetGroupPackage(component->Group);
    if ((this->componentPackageMethod ==
         cmCPackGenerator::ONE_PACKAGE_PER_GROUP) ||
        this->IsOn(prefix + "COMMON")) {
      return package->Name;
    }
    bool dot = !this->ResolveDuplicateNames;
    if (dot && name.substr(0, package->Name.size()) == package->Name) {
      dot = false;
    }
    if (dot) {
      name = package->Name + "." + name;
    }
  }
  return name;
}